

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokFileDesc::~CTcTokFileDesc(CTcTokFileDesc *this)

{
  long in_RDI;
  size_t i;
  undefined8 local_10;
  
  lib_free_str((char *)0x2f002b);
  lib_free_str((char *)0x2f003a);
  free(*(void **)(in_RDI + 0x18));
  free(*(void **)(in_RDI + 0x20));
  free(*(void **)(in_RDI + 0x30));
  free(*(void **)(in_RDI + 0x28));
  if (*(long *)(in_RDI + 0x48) != 0) {
    for (local_10 = 0; local_10 < *(ulong *)(in_RDI + 0x50); local_10 = local_10 + 1) {
      if (*(long *)(*(long *)(in_RDI + 0x48) + local_10 * 8) != 0) {
        free(*(void **)(*(long *)(in_RDI + 0x48) + local_10 * 8));
      }
    }
    free(*(void **)(in_RDI + 0x48));
  }
  return;
}

Assistant:

CTcTokFileDesc::~CTcTokFileDesc()
{
    /* delete the filename and original filename strings */
    lib_free_str(fname_);
    lib_free_str(orig_fname_);

    /* delete the quotable filename strings */
    t3free(dquoted_fname_);
    t3free(squoted_fname_);
    t3free(dquoted_rootname_);
    t3free(squoted_rootname_);

    /* delete each source page we've allocated */
    if (src_pages_ != 0)
    {
        size_t i;

        /* go through the index array and delete each allocated page */
        for (i = 0 ; i < src_pages_alo_ ; ++i)
        {
            /* if this page was allocated, delete it */
            if (src_pages_[i] != 0)
                t3free(src_pages_[i]);
        }
        
        /* delete the source page index array */
        t3free(src_pages_);
    }
}